

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covar.hpp
# Opt level: O1

void duckdb::RegrSlopeOperation::
     Operation<double,double,duckdb::RegrSlopeState,duckdb::RegrSlopeOperation>
               (RegrSlopeState *state,double *y,double *x,AggregateBinaryInput *idata)

{
  double dVar1;
  uint64_t uVar2;
  double dVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  uVar2 = (state->cov_pop).count + 1;
  (state->cov_pop).count = uVar2;
  auVar10._8_4_ = (int)(uVar2 >> 0x20);
  auVar10._0_8_ = uVar2;
  auVar10._12_4_ = 0x45300000;
  dVar4 = (double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0;
  dVar6 = auVar10._8_8_ - 1.9342813113834067e+25;
  dVar1 = *y;
  dVar3 = (state->cov_pop).meanx;
  dVar11 = (state->cov_pop).meany;
  dVar7 = *x - dVar3;
  auVar5._0_8_ = dVar6 + dVar4;
  auVar5._8_8_ = dVar6 + dVar4;
  auVar9._8_8_ = dVar1 - dVar11;
  auVar9._0_8_ = dVar7;
  auVar10 = divpd(auVar9,auVar5);
  dVar11 = auVar10._8_8_ + dVar11;
  (state->cov_pop).meanx = auVar10._0_8_ + dVar3;
  (state->cov_pop).meany = dVar11;
  (state->cov_pop).co_moment = (dVar1 - dVar11) * dVar7 + (state->cov_pop).co_moment;
  uVar2 = (state->var_pop).count + 1;
  (state->var_pop).count = uVar2;
  dVar1 = *x;
  dVar3 = (state->var_pop).mean;
  dVar11 = dVar1 - dVar3;
  auVar8._8_4_ = (int)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._12_4_ = 0x45300000;
  dVar3 = dVar11 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) + dVar3;
  (state->var_pop).mean = dVar3;
  (state->var_pop).dsquared = (dVar1 - dVar3) * dVar11 + (state->var_pop).dsquared;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &y, const B_TYPE &x, AggregateBinaryInput &idata) {
		// update running mean and d^2
		const double n = static_cast<double>(++(state.count));

		const double dx = (x - state.meanx);
		const double meanx = state.meanx + dx / n;

		const double dy = (y - state.meany);
		const double meany = state.meany + dy / n;

		//  Schubert and Gertz SSDBM 2018 (4.3)
		const double C = state.co_moment + dx * (y - meany);

		state.meanx = meanx;
		state.meany = meany;
		state.co_moment = C;
	}